

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroupStamp.cpp
# Opt level: O0

void __thiscall OpenMD::CutoffGroupStamp::CutoffGroupStamp(CutoffGroupStamp *this)

{
  value_type *in_RDI;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [40];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  *(undefined ***)in_RDI = &PTR__CutoffGroupStamp_00485300;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2f991e);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&in_RDI[1].field_2 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,
             (char *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(this_00,in_RDI);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return;
}

Assistant:

CutoffGroupStamp::CutoffGroupStamp() {
    deprecatedKeywords_.insert("nMembers");
  }